

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O2

int hdr_decode_compressed(uint8_t *buffer,size_t length,hdr_histogram **histogram)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  encoding_flyweight_v0_t *peVar6;
  uint counts_limit;
  size_t __size;
  uint uVar7;
  hdr_histogram *h;
  encoding_flyweight_v0_t encoding_flyweight;
  uint8_t *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  encoding_flyweight_v0_t *peStack_90;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (length < 8) {
    return 0x16;
  }
  uVar2 = *(uint *)buffer;
  uVar2 = (uVar2 & 0xfffffff) >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
          (uVar2 & 0xfffffff) << 0x18;
  if (uVar2 == 0x1c849302) {
    h = (hdr_histogram *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    local_98 = 0;
    peStack_90 = (encoding_flyweight_v0_t *)0x0;
    local_a8 = (uint8_t *)0x0;
    uStack_a0 = 0;
    iVar3 = inflateInit_(&local_a8,"1.2.11",0x70);
    iVar4 = -0x752a;
    iVar5 = -0x752a;
    if (iVar3 == 0) {
      uVar2 = *(uint *)(buffer + 4);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (length - 8 < (ulong)uVar2 || (int)uVar2 < 0) {
        iVar5 = 0x16;
        goto LAB_00105185;
      }
      local_a8 = buffer + 8;
      uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar2);
      peStack_90 = &encoding_flyweight;
      local_88 = 0x28;
      iVar3 = inflate(&local_a8,2);
      if (iVar3 != 0) goto LAB_00105185;
      if ((encoding_flyweight.cookie >> 0x18 & 0xffffff0f |
           (encoding_flyweight.cookie & 0xff0000) >> 8 | (encoding_flyweight.cookie & 0xff00) << 8 |
          encoding_flyweight.cookie << 0x18) != 0x1c849301) {
        iVar5 = -0x752e;
        goto LAB_00105185;
      }
      uVar2 = encoding_flyweight.cookie >> 0x1c;
      if (uVar2 == 0) {
        iVar5 = -0x7525;
        goto LAB_00105185;
      }
      peVar6 = (encoding_flyweight_v0_t *)0x0;
      counts_limit = ((uint)encoding_flyweight.significant_figures >> 0x18 |
                      (encoding_flyweight.significant_figures & 0xff0000U) >> 8 |
                      (encoding_flyweight.significant_figures & 0xff00U) << 8 |
                     encoding_flyweight.significant_figures << 0x18) / uVar2;
      iVar5 = hdr_init((ulong)encoding_flyweight.highest_trackable_value >> 0x38 |
                       (encoding_flyweight.highest_trackable_value & 0xff000000000000U) >> 0x28 |
                       (encoding_flyweight.highest_trackable_value & 0xff0000000000U) >> 0x18 |
                       (encoding_flyweight.highest_trackable_value & 0xff00000000U) >> 8 |
                       (encoding_flyweight.highest_trackable_value & 0xff000000U) << 8 |
                       (encoding_flyweight.highest_trackable_value & 0xff0000U) << 0x18 |
                       (encoding_flyweight.highest_trackable_value & 0xff00U) << 0x28 |
                       encoding_flyweight.highest_trackable_value << 0x38,
                       (ulong)encoding_flyweight.total_count >> 0x38 |
                       (encoding_flyweight.total_count & 0xff000000000000U) >> 0x28 |
                       (encoding_flyweight.total_count & 0xff0000000000U) >> 0x18 |
                       (encoding_flyweight.total_count & 0xff00000000U) >> 8 |
                       (encoding_flyweight.total_count & 0xff000000U) << 8 |
                       (encoding_flyweight.total_count & 0xff0000U) << 0x18 |
                       (encoding_flyweight.total_count & 0xff00U) << 0x28 |
                       encoding_flyweight.total_count << 0x38,
                       encoding_flyweight.lowest_discernible_value._4_4_ >> 0x18 |
                       (encoding_flyweight.lowest_discernible_value._4_4_ & 0xff0000) >> 8 |
                       (encoding_flyweight.lowest_discernible_value._4_4_ & 0xff00) << 8 |
                       encoding_flyweight.lowest_discernible_value._4_4_ << 0x18,&h);
      if (iVar5 == 0) {
        uVar7 = counts_limit * uVar2;
        peVar6 = (encoding_flyweight_v0_t *)calloc(1,(long)(int)uVar7);
        if (peVar6 == (encoding_flyweight_v0_t *)0x0) {
          peVar6 = (encoding_flyweight_v0_t *)0x0;
          bVar1 = false;
          iVar4 = 0xc;
        }
        else {
          peStack_90 = peVar6;
          local_88 = uVar7;
          iVar5 = inflate(&local_a8,4);
          bVar1 = false;
          if (iVar5 == 1) {
            apply_to_counts(h,uVar2,(uint8_t *)peVar6,counts_limit);
            h->normalizing_index_offset =
                 (uint)encoding_flyweight.lowest_discernible_value >> 0x18 |
                 ((uint)encoding_flyweight.lowest_discernible_value & 0xff0000) >> 8 |
                 ((uint)encoding_flyweight.lowest_discernible_value & 0xff00) << 8 |
                 (uint)encoding_flyweight.lowest_discernible_value << 0x18;
            h->conversion_ratio =
                 (double)((ulong)encoding_flyweight.counts[0] >> 0x38 |
                          (encoding_flyweight.counts[0] & 0xff000000000000U) >> 0x28 |
                          (encoding_flyweight.counts[0] & 0xff0000000000U) >> 0x18 |
                          (encoding_flyweight.counts[0] & 0xff00000000U) >> 8 |
                          (encoding_flyweight.counts[0] & 0xff000000U) << 8 |
                          (encoding_flyweight.counts[0] & 0xff0000U) << 0x18 |
                          (encoding_flyweight.counts[0] & 0xff00U) << 0x28 |
                         encoding_flyweight.counts[0] << 0x38);
            hdr_reset_internal_counters(h);
            bVar1 = true;
            iVar4 = 0;
          }
        }
      }
      else {
        bVar1 = false;
        iVar4 = 0xc;
      }
    }
    else {
LAB_00105185:
      iVar4 = iVar5;
      peVar6 = (encoding_flyweight_v0_t *)0x0;
      bVar1 = false;
    }
    inflateEnd(&local_a8);
    free(peVar6);
  }
  else {
    if (uVar2 == 0x1c849304) {
      h = (hdr_histogram *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_84 = 0;
      uStack_80 = 0;
      local_98 = 0;
      peStack_90 = (encoding_flyweight_v0_t *)0x0;
      local_a8 = (uint8_t *)0x0;
      uStack_a0 = 0;
      iVar5 = inflateInit_(&local_a8,"1.2.11",0x70);
      iVar4 = -0x752a;
      if (iVar5 == 0) {
        uVar2 = *(uint *)(buffer + 4);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        if (length - 8 < (ulong)uVar2 || (int)uVar2 < 0) {
          iVar4 = 0x16;
          goto LAB_00105158;
        }
        local_a8 = buffer + 8;
        uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar2);
        peStack_90 = &encoding_flyweight;
        local_88 = 0x28;
        iVar5 = inflate(&local_a8,2);
        if (iVar5 != 0) goto LAB_00105158;
        if ((encoding_flyweight.cookie & 0xfffffff) != 0x393841c) {
          iVar4 = -0x752e;
          goto LAB_00105158;
        }
        iVar4 = hdr_init((ulong)encoding_flyweight.highest_trackable_value >> 0x38 |
                         (encoding_flyweight.highest_trackable_value & 0xff000000000000U) >> 0x28 |
                         (encoding_flyweight.highest_trackable_value & 0xff0000000000U) >> 0x18 |
                         (encoding_flyweight.highest_trackable_value & 0xff00000000U) >> 8 |
                         (encoding_flyweight.highest_trackable_value & 0xff000000U) << 8 |
                         (encoding_flyweight.highest_trackable_value & 0xff0000U) << 0x18 |
                         (encoding_flyweight.highest_trackable_value & 0xff00U) << 0x28 |
                         encoding_flyweight.highest_trackable_value << 0x38,
                         (ulong)encoding_flyweight.total_count >> 0x38 |
                         (encoding_flyweight.total_count & 0xff000000000000U) >> 0x28 |
                         (encoding_flyweight.total_count & 0xff0000000000U) >> 0x18 |
                         (encoding_flyweight.total_count & 0xff00000000U) >> 8 |
                         (encoding_flyweight.total_count & 0xff000000U) << 8 |
                         (encoding_flyweight.total_count & 0xff0000U) << 0x18 |
                         (encoding_flyweight.total_count & 0xff00U) << 0x28 |
                         encoding_flyweight.total_count << 0x38,
                         encoding_flyweight.lowest_discernible_value._4_4_ >> 0x18 |
                         (encoding_flyweight.lowest_discernible_value._4_4_ & 0xff0000) >> 8 |
                         (encoding_flyweight.lowest_discernible_value._4_4_ & 0xff00) << 8 |
                         encoding_flyweight.lowest_discernible_value._4_4_ << 0x18,&h);
        if (iVar4 == 0) {
          uVar2 = (uint)encoding_flyweight.significant_figures >> 0x18 |
                  (encoding_flyweight.significant_figures & 0xff0000U) >> 8 |
                  (encoding_flyweight.significant_figures & 0xff00U) << 8 |
                  encoding_flyweight.significant_figures << 0x18;
          peVar6 = (encoding_flyweight_v0_t *)calloc(1,(long)(int)uVar2 + 9);
          if (peVar6 == (encoding_flyweight_v0_t *)0x0) {
            iVar4 = 0xc;
            goto LAB_00105158;
          }
          peStack_90 = peVar6;
          local_88 = uVar2;
          iVar5 = inflate(&local_a8,4);
          iVar4 = -0x752a;
          if ((iVar5 == 1) && (iVar4 = apply_to_counts_zz(h,(uint8_t *)peVar6,uVar2), iVar4 == 0)) {
            h->normalizing_index_offset =
                 (uint)encoding_flyweight.lowest_discernible_value >> 0x18 |
                 ((uint)encoding_flyweight.lowest_discernible_value & 0xff0000) >> 8 |
                 ((uint)encoding_flyweight.lowest_discernible_value & 0xff00) << 8 |
                 (uint)encoding_flyweight.lowest_discernible_value << 0x18;
            h->conversion_ratio =
                 (double)((ulong)encoding_flyweight.counts[0] >> 0x38 |
                          (encoding_flyweight.counts[0] & 0xff000000000000U) >> 0x28 |
                          (encoding_flyweight.counts[0] & 0xff0000000000U) >> 0x18 |
                          (encoding_flyweight.counts[0] & 0xff00000000U) >> 8 |
                          (encoding_flyweight.counts[0] & 0xff000000U) << 8 |
                          (encoding_flyweight.counts[0] & 0xff0000U) << 0x18 |
                          (encoding_flyweight.counts[0] & 0xff00U) << 0x28 |
                         encoding_flyweight.counts[0] << 0x38);
            hdr_reset_internal_counters(h);
            iVar4 = 0;
          }
        }
        else {
          peVar6 = (encoding_flyweight_v0_t *)0x0;
        }
      }
      else {
LAB_00105158:
        peVar6 = (encoding_flyweight_v0_t *)0x0;
      }
      inflateEnd(&local_a8);
      free(peVar6);
      if (iVar4 != 0) goto LAB_00105171;
      goto LAB_0010519f;
    }
    if (uVar2 != 0x1c849309) {
      return -29999;
    }
    h = (hdr_histogram *)0x0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    local_98 = 0;
    peStack_90 = (encoding_flyweight_v0_t *)0x0;
    local_a8 = (uint8_t *)0x0;
    uStack_a0 = 0;
    iVar3 = inflateInit_(&local_a8,"1.2.11",0x70);
    iVar4 = -0x752a;
    iVar5 = -0x752a;
    if (iVar3 == 0) {
      uVar2 = *(uint *)(buffer + 4);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (length - 8 < (ulong)uVar2 || (int)uVar2 < 0) {
        iVar5 = 0x16;
        goto LAB_001051d9;
      }
      local_a8 = buffer + 8;
      uStack_a0 = CONCAT44(uStack_a0._4_4_,uVar2);
      peStack_90 = &encoding_flyweight;
      local_88 = 0x20;
      iVar3 = inflate(&local_a8,2);
      if (iVar3 != 0) goto LAB_001051d9;
      if ((encoding_flyweight.cookie >> 0x18 & 0xffffff0f |
           (encoding_flyweight.cookie & 0xff0000) >> 8 | (encoding_flyweight.cookie & 0xff00) << 8 |
          encoding_flyweight.cookie << 0x18) != 0x1c849308) {
        iVar5 = -0x752e;
        goto LAB_001051d9;
      }
      iVar5 = hdr_init((ulong)(encoding_flyweight.lowest_discernible_value._4_4_ >> 0x18) |
                       (((ulong)encoding_flyweight.lowest_discernible_value._4_4_ & 0xff0000) <<
                       0x20) >> 0x28 |
                       (((ulong)encoding_flyweight.lowest_discernible_value._4_4_ & 0xff00) << 0x20)
                       >> 0x18 | (((ulong)encoding_flyweight.lowest_discernible_value._4_4_ & 0xff)
                                 << 0x20) >> 8 |
                       ((ulong)(uint)encoding_flyweight.lowest_discernible_value & 0xff000000) << 8
                       | ((ulong)(uint)encoding_flyweight.lowest_discernible_value & 0xff0000) <<
                         0x18 | ((ulong)(uint)encoding_flyweight.lowest_discernible_value & 0xff00)
                                << 0x28 |
                       CONCAT44(encoding_flyweight.lowest_discernible_value._4_4_,
                                (uint)encoding_flyweight.lowest_discernible_value) << 0x38,
                       (ulong)encoding_flyweight.highest_trackable_value >> 0x38 |
                       (encoding_flyweight.highest_trackable_value & 0xff000000000000U) >> 0x28 |
                       (encoding_flyweight.highest_trackable_value & 0xff0000000000U) >> 0x18 |
                       (encoding_flyweight.highest_trackable_value & 0xff00000000U) >> 8 |
                       (encoding_flyweight.highest_trackable_value & 0xff000000U) << 8 |
                       (encoding_flyweight.highest_trackable_value & 0xff0000U) << 0x18 |
                       (encoding_flyweight.highest_trackable_value & 0xff00U) << 0x28 |
                       encoding_flyweight.highest_trackable_value << 0x38,
                       (uint)encoding_flyweight.significant_figures >> 0x18 |
                       (encoding_flyweight.significant_figures & 0xff0000U) >> 8 |
                       (encoding_flyweight.significant_figures & 0xff00U) << 8 |
                       encoding_flyweight.significant_figures << 0x18,&h);
      if (iVar5 == 0) {
        __size = (long)h->counts_len * (ulong)(encoding_flyweight.cookie >> 0x1c);
        peVar6 = (encoding_flyweight_v0_t *)calloc(1,__size);
        if (peVar6 == (encoding_flyweight_v0_t *)0x0) goto LAB_00105145;
        local_88 = (uint)__size;
        peStack_90 = peVar6;
        iVar5 = inflate(&local_a8,4);
        bVar1 = false;
        if (iVar5 == 1) {
          apply_to_counts(h,encoding_flyweight.cookie >> 0x1c,(uint8_t *)peVar6,h->counts_len);
          hdr_reset_internal_counters(h);
          h->normalizing_index_offset = 0;
          h->conversion_ratio = 1.0;
          bVar1 = true;
          iVar4 = 0;
        }
      }
      else {
LAB_00105145:
        peVar6 = (encoding_flyweight_v0_t *)0x0;
        bVar1 = false;
        iVar4 = 0xc;
      }
    }
    else {
LAB_001051d9:
      iVar4 = iVar5;
      peVar6 = (encoding_flyweight_v0_t *)0x0;
      bVar1 = false;
    }
    inflateEnd(&local_a8);
    free(peVar6);
  }
  if (!bVar1) {
LAB_00105171:
    hdr_close(h);
    return iVar4;
  }
LAB_0010519f:
  if (*histogram == (hdr_histogram *)0x0) {
    *histogram = h;
  }
  else {
    hdr_add(*histogram,h);
    free(h);
  }
  return iVar4;
}

Assistant:

int hdr_decode_compressed(
    uint8_t* buffer, size_t length, struct hdr_histogram** histogram)
{
    uint32_t compression_cookie;
    compression_flyweight_t* compression_flyweight;

    if (length < SIZEOF_COMPRESSION_FLYWEIGHT)
    {
        return EINVAL;
    }

    compression_flyweight = (compression_flyweight_t*) buffer;

    compression_cookie = get_cookie_base(be32toh(compression_flyweight->cookie));
    if (V0_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v0(compression_flyweight, length, histogram);
    }
    else if (V1_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v1(compression_flyweight, length, histogram);
    }
    else if (V2_COMPRESSION_COOKIE == compression_cookie)
    {
        return hdr_decode_compressed_v2(compression_flyweight, length, histogram);
    }

    return HDR_COMPRESSION_COOKIE_MISMATCH;
}